

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<capnp::compiler::CompilerMain::SourceFile> * __thiscall
kj::ArrayBuilder<capnp::compiler::CompilerMain::SourceFile>::operator=
          (ArrayBuilder<capnp::compiler::CompilerMain::SourceFile> *this,
          ArrayBuilder<capnp::compiler::CompilerMain::SourceFile> *other)

{
  ArrayBuilder<capnp::compiler::CompilerMain::SourceFile> *other_local;
  ArrayBuilder<capnp::compiler::CompilerMain::SourceFile> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (SourceFile *)0x0;
  other->pos = (RemoveConst<capnp::compiler::CompilerMain::SourceFile> *)0x0;
  other->endPtr = (SourceFile *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }